

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.cpp
# Opt level: O0

void __thiscall Simulation::printStatus(Simulation *this,uint64_t it,float dt)

{
  ostream *poVar1;
  void *pvVar2;
  float dt_local;
  uint64_t it_local;
  Simulation *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\x1b[2J");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "fluid-simulation - Tristan Marrec 2021 - Supervised by Ryoichi Ando");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[1m=== CONFIGURATION ===\x1b[0m");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[42m[GRID]\x1b[49m");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"N             = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,Config::N);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"dim           = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,Config::dim);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[42m[SOLVER]\x1b[49m");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"solver        = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,Config::solver);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"advection     = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,Config::advection);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[42m[FLUID]\x1b[49m");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"dt            = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,Config::dt);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[42m[RENDER]\x1b[49m");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"exportFrames  = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(Config::exportFrames & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"renderFrames  = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(Config::renderFrames & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"witdh         = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,Config::width);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"height        = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,Config::height);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"endFrame      = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,Config::endFrame);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[1m=====================\x1b[0m");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (it != 0) {
    std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
    poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[1mITERATION ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,it);
    poVar1 = std::operator<<(poVar1,"\x1b[0m was computed in ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dt);
    poVar1 = std::operator<<(poVar1," sec !");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Simulation::printStatus(const std::uint64_t it, const float dt) const
{
    std::cout << "\033[2J" << std::endl;
    PRINT_TITLE();
    INFO("\033[1m=== CONFIGURATION ===\033[0m");
    INFO("\033[42m[GRID]\033[49m")
    INFO("N             = " << Config::N);
    INFO("dim           = " << Config::dim);
    INFO("\033[42m[SOLVER]\033[49m")
    INFO("solver        = " << Config::solver);
    INFO("advection     = " << Config::advection);
    INFO("\033[42m[FLUID]\033[49m")
    INFO("dt            = " << Config::dt);
    INFO("\033[42m[RENDER]\033[49m")
    INFO("exportFrames  = " << Config::exportFrames);
    INFO("renderFrames  = " << Config::renderFrames);
    INFO("witdh         = " << Config::width);
    INFO("height        = " << Config::height);
    INFO("endFrame      = " << Config::endFrame);
    INFO("\033[1m=====================\033[0m");
    if (it > 0)
    {
        INFO("\033[1mITERATION " << it << "\033[0m was computed in "
                << dt << " sec !");
    }
}